

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

bool cmPolicies::ApplyPolicyVersion
               (cmMakefile *mf,string *version_min,string *version_max,WarnCompat warnCompat)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined8 uVar7;
  ulong uVar8;
  string local_118;
  string local_f8;
  uint local_d4;
  uint local_d0;
  uint maxTweak;
  uint maxPatch;
  uint maxMinor;
  uint maxMajor;
  uint polPatch;
  uint polMinor;
  uint polMajor;
  allocator<char> local_91;
  string local_90;
  string local_60;
  uint local_3c;
  uint local_38;
  uint minTweak;
  uint minPatch;
  uint minMinor;
  uint minMajor;
  WarnCompat warnCompat_local;
  string *version_max_local;
  string *version_min_local;
  cmMakefile *mf_local;
  
  minPatch = 2;
  minTweak = 0;
  local_38 = 0;
  local_3c = 0;
  minMinor = warnCompat;
  _minMajor = version_max;
  version_max_local = version_min;
  version_min_local = (string *)mf;
  uVar7 = std::__cxx11::string::c_str();
  iVar3 = __isoc99_sscanf(uVar7,"%u.%u.%u.%u",&minPatch,&minTweak,&local_38,&local_3c);
  psVar1 = version_min_local;
  uVar6 = minPatch;
  if (iVar3 < 2) {
    cmStrCat<char_const(&)[31],std::__cxx11::string_const&,char_const(&)[57]>
              (&local_60,(char (*) [31])"Invalid policy version value \"",version_max_local,
               (char (*) [57])"\".  A numeric major.minor[.patch[.tweak]] must be given.");
    cmMakefile::IssueMessage((cmMakefile *)psVar1,FATAL_ERROR,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    return false;
  }
  if ((minPatch < 2) || ((minPatch == 2 && (minTweak < 4)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,
               "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.  For compatibility with older versions please use any CMake 2.8.x release or lower."
               ,&local_91);
    cmMakefile::IssueMessage((cmMakefile *)psVar1,FATAL_ERROR,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    return false;
  }
  uVar4 = cmVersion::GetMajorVersion();
  uVar5 = minPatch;
  if ((((uVar4 < uVar6) ||
       ((uVar4 = cmVersion::GetMajorVersion(), uVar6 = minTweak, uVar5 == uVar4 &&
        (uVar5 = cmVersion::GetMinorVersion(), uVar5 < uVar6)))) ||
      ((uVar5 = minPatch, uVar4 = cmVersion::GetMajorVersion(), uVar6 = minTweak, uVar5 == uVar4 &&
       ((uVar4 = cmVersion::GetMinorVersion(), uVar5 = local_38, uVar6 == uVar4 &&
        (uVar6 = cmVersion::GetPatchVersion(), uVar6 < uVar5)))))) ||
     ((uVar5 = minPatch, uVar4 = cmVersion::GetMajorVersion(), uVar6 = minTweak, uVar5 == uVar4 &&
      (((uVar4 = cmVersion::GetMinorVersion(), uVar5 = local_38, uVar6 == uVar4 &&
        (uVar4 = cmVersion::GetPatchVersion(), uVar6 = local_3c, uVar5 == uVar4)) &&
       (uVar5 = cmVersion::GetTweakVersion(), uVar5 < uVar6)))))) {
    psVar1 = version_min_local;
    cmStrCat<char_const(&)[60],std::__cxx11::string_const&,char_const(&)[49],char_const(&)[154]>
              ((string *)&polMinor,
               (char (*) [60])"An attempt was made to set the policy version of CMake to \"",
               version_max_local,(char (*) [49])"\" which is greater than this version of CMake.  ",
               (char (*) [154])
               "This is not allowed because the greater version may have new policies not known to this CMake.  You may need a newer CMake version to build this project."
              );
    cmMakefile::IssueMessage((cmMakefile *)psVar1,FATAL_ERROR,(string *)&polMinor);
    std::__cxx11::string::~string((string *)&polMinor);
    return false;
  }
  polPatch = minPatch;
  maxMajor = minTweak;
  maxMinor = local_38;
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    maxPatch = 0;
    maxTweak = 0;
    local_d0 = 0;
    local_d4 = 0;
    uVar7 = std::__cxx11::string::c_str();
    iVar3 = __isoc99_sscanf(uVar7,"%u.%u.%u.%u",&maxPatch,&maxTweak,&local_d0,&local_d4);
    psVar1 = version_min_local;
    if (iVar3 < 2) {
      cmStrCat<char_const(&)[35],std::__cxx11::string_const&,char_const(&)[57]>
                (&local_f8,(char (*) [35])"Invalid policy max version value \"",_minMajor,
                 (char (*) [57])"\".  A numeric major.minor[.patch[.tweak]] must be given.");
      cmMakefile::IssueMessage((cmMakefile *)psVar1,FATAL_ERROR,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      return false;
    }
    if ((((maxPatch < minPatch) || ((minPatch == maxPatch && (maxTweak < minTweak)))) ||
        ((minPatch == maxPatch && ((minTweak == maxTweak && (local_d0 < local_38)))))) ||
       ((minPatch == maxPatch &&
        (((minTweak == maxTweak && (local_38 == local_d0)) && (local_d4 < local_3c)))))) {
      cmStrCat<char_const(&)[23],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[43]>
                (&local_118,(char (*) [23])"Policy VERSION range \"",version_max_local,
                 (char (*) [4])0x116e473,_minMajor,
                 (char (*) [43])"\" specifies a larger minimum than maximum.");
      cmMakefile::IssueMessage((cmMakefile *)psVar1,FATAL_ERROR,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      return false;
    }
    polPatch = maxPatch;
    maxMajor = maxTweak;
    maxMinor = local_d0;
  }
  bVar2 = ApplyPolicyVersion((cmMakefile *)version_min_local,polPatch,maxMajor,maxMinor,minMinor);
  return bVar2;
}

Assistant:

bool cmPolicies::ApplyPolicyVersion(cmMakefile* mf,
                                    std::string const& version_min,
                                    std::string const& version_max,
                                    WarnCompat warnCompat)
{
  // Parse components of the minimum version.
  unsigned int minMajor = 2;
  unsigned int minMinor = 0;
  unsigned int minPatch = 0;
  unsigned int minTweak = 0;
  if (sscanf(version_min.c_str(), "%u.%u.%u.%u", &minMajor, &minMinor,
             &minPatch, &minTweak) < 2) {
    mf->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Invalid policy version value \"", version_min,
               "\".  "
               "A numeric major.minor[.patch[.tweak]] must be given."));
    return false;
  }

  // it is an error if the policy version is less than 2.4
  if (minMajor < 2 || (minMajor == 2 && minMinor < 4)) {
    mf->IssueMessage(
      MessageType::FATAL_ERROR,
      "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.  "
      "For compatibility with older versions please use any CMake 2.8.x "
      "release or lower.");
    return false;
  }

  // It is an error if the policy version is greater than the running
  // CMake.
  if (minMajor > cmVersion::GetMajorVersion() ||
      (minMajor == cmVersion::GetMajorVersion() &&
       minMinor > cmVersion::GetMinorVersion()) ||
      (minMajor == cmVersion::GetMajorVersion() &&
       minMinor == cmVersion::GetMinorVersion() &&
       minPatch > cmVersion::GetPatchVersion()) ||
      (minMajor == cmVersion::GetMajorVersion() &&
       minMinor == cmVersion::GetMinorVersion() &&
       minPatch == cmVersion::GetPatchVersion() &&
       minTweak > cmVersion::GetTweakVersion())) {
    mf->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("An attempt was made to set the policy version of CMake to \"",
               version_min,
               "\" which is greater than this version of CMake.  ",
               "This is not allowed because the greater version may have new "
               "policies not known to this CMake.  "
               "You may need a newer CMake version to build this project."));
    return false;
  }

  unsigned int polMajor = minMajor;
  unsigned int polMinor = minMinor;
  unsigned int polPatch = minPatch;

  if (!version_max.empty()) {
    // Parse components of the maximum version.
    unsigned int maxMajor = 0;
    unsigned int maxMinor = 0;
    unsigned int maxPatch = 0;
    unsigned int maxTweak = 0;
    if (sscanf(version_max.c_str(), "%u.%u.%u.%u", &maxMajor, &maxMinor,
               &maxPatch, &maxTweak) < 2) {
      mf->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("Invalid policy max version value \"", version_max,
                 "\".  "
                 "A numeric major.minor[.patch[.tweak]] must be given."));
      return false;
    }

    // It is an error if the min version is greater than the max version.
    if (minMajor > maxMajor || (minMajor == maxMajor && minMinor > maxMinor) ||
        (minMajor == maxMajor && minMinor == maxMinor &&
         minPatch > maxPatch) ||
        (minMajor == maxMajor && minMinor == maxMinor &&
         minPatch == maxPatch && minTweak > maxTweak)) {
      mf->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("Policy VERSION range \"", version_min, "...", version_max,
                 "\" specifies a larger minimum than maximum."));
      return false;
    }

    // Use the max version as the policy version.
    polMajor = maxMajor;
    polMinor = maxMinor;
    polPatch = maxPatch;
  }

  return cmPolicies::ApplyPolicyVersion(mf, polMajor, polMinor, polPatch,
                                        warnCompat);
}